

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O1

void __thiscall TTD::UtilSupport::TTAutoString::Clear(TTAutoString *this)

{
  if (this->m_contents != (char16_t *)0x0) {
    Memory::DeleteArray<Memory::HeapAllocator,char16_t>
              (&Memory::HeapAllocator::Instance,this->m_allocSize,this->m_contents);
    this->m_allocSize = -1;
    this->m_contents = (char16 *)0x0;
  }
  if (this->m_optFormatBuff != (char16 *)0x0) {
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this->m_optFormatBuff,0x80);
    this->m_optFormatBuff = (char16 *)0x0;
  }
  return;
}

Assistant:

void TTAutoString::Clear()
        {
            if(this->m_contents != nullptr)
            {
                TT_HEAP_FREE_ARRAY(char16, this->m_contents, (size_t)this->m_allocSize);
                this->m_allocSize = -1;
                this->m_contents = nullptr;
            }

            if(this->m_optFormatBuff != nullptr)
            {
                TT_HEAP_FREE_ARRAY(char16, this->m_optFormatBuff, 64);
                this->m_optFormatBuff = nullptr;
            }
        }